

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void e2e_crash_recover_test(bool do_rollback)

{
  fdb_status fVar1;
  int iVar2;
  time_t tVar3;
  storage_t *st;
  size_t valuelen;
  char *pcVar4;
  char cVar5;
  long lVar6;
  fdb_kvs_handle *pfVar7;
  fdb_file_handle *ptr_fhandle;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  fdb_kvs_handle **ppfVar13;
  undefined7 in_register_00000039;
  idx_prams_t *params;
  checkpoint_t *pcVar14;
  fdb_kvs_handle **ppfVar15;
  storage_t *psVar16;
  fdb_kvs_handle **ptr_handle;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  idx_prams_t index_params;
  timeval __test_begin;
  fdb_kvs_info info;
  fdb_config fconfig;
  checkpoint_t verification_checkpoint;
  fdb_file_handle fStackY_f80;
  undefined1 auStackY_f58 [24];
  timeval tStackY_f40;
  fdb_kvs_handle *apfStackY_f30 [16];
  pthread_t apStackY_eb0 [16];
  char acStackY_e30 [72];
  fdb_config fStackY_de8;
  void *apvStackY_cf0 [17];
  fdb_kvs_handle *pfStackY_c68;
  char *pcStackY_c60;
  ulong uStackY_c58;
  fdb_kvs_handle **ppfStackY_c50;
  char *pcStackY_c48;
  code *pcStackY_c40;
  fdb_file_handle *pfStack_c30;
  fdb_iterator *pfStack_c28;
  fdb_kvs_handle *pfStack_c20;
  fdb_kvs_handle *apfStack_c18 [9];
  timeval tStack_bd0;
  undefined1 auStack_bc0 [216];
  char acStack_ae8 [64];
  fdb_config fStack_aa8;
  long lStack_9b0;
  char *pcStack_9a8;
  code *pcStack_9a0;
  fdb_config *pfStack_998;
  char *pcStack_990;
  code *pcStack_988;
  fdb_kvs_config fStack_978;
  timeval tStack_960;
  fdb_file_handle *apfStack_950 [16];
  fdb_kvs_handle *apfStack_8d0 [16];
  pthread_t apStack_850 [16];
  char acStack_7d0 [64];
  void *apvStack_790 [16];
  fdb_config fStack_710;
  ulong uStack_618;
  idx_prams_t *piStack_610;
  checkpoint_t *pcStack_608;
  storage_t *psStack_600;
  storage_t *psStack_5f8;
  code *pcStack_5f0;
  checkpoint_t *local_5e0;
  fdb_snapshot_info_t *local_5d8;
  fdb_kvs_handle *local_5d0;
  fdb_kvs_config local_5c8;
  idx_prams_t local_5b0;
  timeval local_598;
  undefined1 local_588 [76];
  undefined4 local_53c;
  undefined1 local_537;
  undefined4 local_534;
  undefined1 local_529;
  checkpoint_t local_460;
  
  uVar11 = CONCAT71(in_register_00000039,do_rollback) & 0xffffffff;
  pcStack_5f0 = (code *)0x1085d3;
  gettimeofday(&local_598,(__timezone_ptr_t)0x0);
  pcStack_5f0 = (code *)0x1085d8;
  memleak_start();
  pcStack_5f0 = (code *)0x1085df;
  tVar3 = time((time_t *)0x0);
  pcStack_5f0 = (code *)0x1085e6;
  srand((uint)tVar3);
  pcStack_5f0 = (code *)0x1085eb;
  rm_storage_fs();
  pcStack_5f0 = (code *)0x1085f8;
  fdb_get_default_kvs_config();
  pcStack_5f0 = (code *)0x108608;
  fdb_get_default_config();
  local_534 = 1;
  local_529 = 0;
  local_537 = 2;
  local_53c._0_1_ = '\x1e';
  local_53c._1_1_ = '\0';
  local_53c._2_1_ = false;
  local_53c._3_1_ = false;
  params = &local_5b0;
  pcStack_5f0 = (code *)0x10862f;
  gen_index_params(params);
  pcVar14 = &local_460;
  pcStack_5f0 = (code *)0x108646;
  memset(pcVar14,0,0x430);
  pcStack_5f0 = (code *)0x108660;
  st = init_storage((fdb_config *)(local_588 + 0x30),(fdb_config *)(local_588 + 0x30),&local_5c8,
                    params,pcVar14,true);
  uVar10 = 100;
  do {
    pcStack_5f0 = (code *)0x108673;
    load_persons(st);
    pcStack_5f0 = (code *)0x108680;
    e2e_fdb_commit(st->main,true);
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
  } while (uVar9 != 0);
  pcStack_5f0 = (code *)0x108696;
  fVar1 = fdb_get_all_snap_markers(st->main,&local_5d8,(uint64_t *)&local_5e0);
  cVar5 = (char)uVar11;
  psVar16 = st;
  if (cVar5 != '\0') {
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (local_5e0 != (checkpoint_t *)0x0) {
        psVar16 = (storage_t *)&st->all_docs;
        params = (idx_prams_t *)0x10;
        pcVar14 = (checkpoint_t *)0x0;
        do {
          pcStack_5f0 = (code *)0x1086cc;
          fVar1 = fdb_rollback((fdb_kvs_handle **)psVar16,
                               *(fdb_seqnum_t *)
                                (*(long *)(params->min + (long)&local_5d8->marker) + 8));
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108879;
          pcVar14 = (checkpoint_t *)(pcVar14->key + 10);
          params = params + 10;
        } while (pcVar14 < local_5e0);
        goto LAB_00108718;
      }
      goto LAB_001086fb;
    }
    goto LAB_0010887e;
  }
  if (fVar1 == FDB_RESULT_SUCCESS) {
    if (local_5e0 != (checkpoint_t *)0x0) {
      pcVar14 = (checkpoint_t *)0x0;
      do {
        pcStack_5f0 = (code *)0x10870a;
        load_persons(st);
        pcVar14 = (checkpoint_t *)(pcVar14->key + 10);
      } while (pcVar14 < local_5e0);
      goto LAB_00108718;
    }
LAB_001086fb:
    local_5e0 = (checkpoint_t *)0x0;
LAB_00108718:
    pcStack_5f0 = (code *)0x108722;
    fdb_free_snap_markers(local_5d8,(uint64_t)local_5e0);
    pcStack_5f0 = (code *)0x10872a;
    e2e_fdb_close(st);
    pcStack_5f0 = (code *)0x108736;
    corrupt_latest_superblock("e2edb_main");
    pcStack_5f0 = (code *)0x108743;
    gen_index_params(&local_5b0);
    pcStack_5f0 = (code *)0x10875a;
    memset(&local_460,0,0x430);
    pcStack_5f0 = (code *)0x10877b;
    st = init_storage((fdb_config *)(local_588 + 0x30),(fdb_config *)(local_588 + 0x30),&local_5c8,
                      &local_5b0,&local_460,true);
    uVar10 = 1;
    psVar16 = (storage_t *)local_588;
    params = (idx_prams_t *)&local_5d0;
    do {
      pcStack_5f0 = (code *)0x108793;
      load_persons(st);
      pcVar14 = (checkpoint_t *)0x64;
      do {
        pcStack_5f0 = (code *)0x1087a1;
        load_persons(st);
        pcStack_5f0 = (code *)0x1087ae;
        e2e_fdb_commit(st->main,true);
        pcStack_5f0 = (code *)0x1087ba;
        fVar1 = fdb_get_kvs_info(st->all_docs,(fdb_kvs_info *)psVar16);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pcStack_5f0 = (code *)0x108879;
          e2e_crash_recover_test();
          goto LAB_00108879;
        }
        pcStack_5f0 = (code *)0x1087d3;
        fdb_snapshot_open(st->all_docs,(fdb_kvs_handle **)params,local_588._8_8_);
        pcStack_5f0 = (code *)0x1087e0;
        update_index(st,true);
        pcStack_5f0 = (code *)0x1087e8;
        verify_db(st);
        pcStack_5f0 = (code *)0x1087f2;
        fdb_kvs_close(local_5d0);
        uVar9 = (int)pcVar14 - 1;
        pcVar14 = (checkpoint_t *)(ulong)uVar9;
      } while (uVar9 != 0);
      cVar8 = (char)uVar10;
      uVar10 = 0;
      if (cVar8 == '\0') {
        pcStack_5f0 = (code *)0x10880a;
        e2e_fdb_shutdown(st);
        pcStack_5f0 = (code *)0x10880f;
        memleak_end();
        if (cVar5 == '\0') {
          if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
            pcVar12 = "%s PASSED\n";
          }
          else {
            pcVar12 = "%s FAILED\n";
          }
          pcVar4 = "TEST: e2e crash recover test";
        }
        else {
          if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
            pcVar12 = "%s PASSED\n";
          }
          else {
            pcVar12 = "%s FAILED\n";
          }
          pcVar4 = "TEST: e2e crash recover test with rollback";
        }
        pcStack_5f0 = (code *)0x108862;
        fprintf(_stderr,pcVar12,pcVar4);
        return;
      }
    } while( true );
  }
LAB_00108883:
  pcStack_5f0 = e2e_multi_dbfile_concurrent_wr;
  e2e_crash_recover_test();
  pcStack_988 = (code *)0x1088a5;
  uStack_618 = uVar11;
  piStack_610 = params;
  pcStack_608 = pcVar14;
  psStack_600 = st;
  psStack_5f8 = psVar16;
  pcStack_5f0 = (code *)uVar10;
  gettimeofday(&tStack_960,(__timezone_ptr_t)0x0);
  pcStack_988 = (code *)0x1088aa;
  memleak_start();
  pcStack_988 = (code *)0x1088b1;
  tVar3 = time((time_t *)0x0);
  pcStack_988 = (code *)0x1088b8;
  srand((uint)tVar3);
  pcStack_988 = (code *)0x1088bd;
  rm_storage_fs();
  pcStack_988 = (code *)0x1088c9;
  system("rm -rf  e2edb_ex* > errorlog.txt");
  pcStack_988 = (code *)0x1088d9;
  fdb_get_default_config();
  pcStack_988 = (code *)0x1088e3;
  fdb_get_default_kvs_config();
  fStack_710.compaction_mode = '\0';
  lVar6 = 0;
  uVar11 = 0;
  while( true ) {
    pcStack_988 = (code *)0x108913;
    sprintf(acStack_7d0,"e2edb_ex%d",uVar11);
    pcStack_988 = (code *)0x108926;
    fVar1 = fdb_open((fdb_file_handle **)((long)apfStack_950 + lVar6),acStack_7d0,&fStack_710);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pcStack_988 = (code *)0x108948;
    fVar1 = fdb_kvs_open_default
                      (*(fdb_file_handle **)((long)apfStack_950 + lVar6),
                       (fdb_kvs_handle **)((long)apfStack_8d0 + lVar6),&fStack_978);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_988 = (code *)0x108a0e;
      e2e_multi_dbfile_concurrent_wr();
      break;
    }
    pcStack_988 = (code *)0x10896d;
    pthread_create((pthread_t *)((long)apStack_850 + lVar6),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStack_8d0 + lVar6));
    uVar11 = (ulong)((int)uVar11 + 1);
    lVar6 = lVar6 + 8;
    if (lVar6 == 0x80) {
      lVar6 = 0;
      do {
        pcStack_988 = (code *)0x108996;
        pthread_join(*(pthread_t *)((long)apStack_850 + lVar6),(void **)((long)apvStack_790 + lVar6)
                    );
        pcStack_988 = (code *)0x1089a5;
        fdb_commit(*(fdb_file_handle **)((long)apfStack_950 + lVar6),'\x01');
        pcStack_988 = (code *)0x1089af;
        fdb_close(*(fdb_file_handle **)((long)apfStack_950 + lVar6));
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x80);
      pcStack_988 = (code *)0x1089c1;
      fdb_shutdown();
      pcStack_988 = (code *)0x1089c6;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (e2e_multi_dbfile_concurrent_wr()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_988 = (code *)0x1089f7;
      fprintf(_stderr,pcVar12,"TEST: e2e multi dbfile concurrent wr");
      return;
    }
  }
  pcStack_988 = e2e_multi_kvs_concurrent_wr;
  e2e_multi_dbfile_concurrent_wr();
  pcStack_990 = "e2edb_ex%d";
  pcStack_9a0 = update_thread;
  pcStackY_c40 = (code *)0x108a30;
  lStack_9b0 = lVar6;
  pcStack_9a8 = acStack_7d0;
  pfStack_998 = &fStack_710;
  pcStack_988 = (code *)uVar11;
  gettimeofday(&tStack_bd0,(__timezone_ptr_t)0x0);
  pcStackY_c40 = (code *)0x108a35;
  memleak_start();
  pfStack_c20 = (fdb_kvs_handle *)0x0;
  pcStackY_c40 = (code *)0x108a45;
  tVar3 = time((time_t *)0x0);
  pcStackY_c40 = (code *)0x108a4c;
  srand((uint)tVar3);
  pcStackY_c40 = (code *)0x108a51;
  rm_storage_fs();
  pcStackY_c40 = (code *)0x108a5d;
  system("rm -rf  e2edb_main > errorlog.txt");
  pcStackY_c40 = (code *)0x108a6d;
  fdb_get_default_config();
  fStack_aa8.num_keeping_headers = 10;
  pfVar7 = (fdb_kvs_handle *)auStack_bc0;
  pcStackY_c40 = (code *)0x108a85;
  fdb_get_default_kvs_config();
  fStack_aa8.compaction_mode = '\0';
  pcStackY_c40 = (code *)0x108a9e;
  fdb_open(&pfStack_c30,"e2edb_main",&fStack_aa8);
  ppfVar15 = apfStack_c18;
  pcVar4 = "e2edb_kv%d";
  pcVar12 = auStack_bc0 + 0x58;
  uVar10 = 0;
  do {
    pcStackY_c40 = (code *)0x108ac5;
    sprintf(pcVar12,"e2edb_kv%d",uVar10 & 0xffffffff);
    pcStackY_c40 = (code *)0x108ad8;
    fVar1 = fdb_kvs_open(pfStack_c30,ppfVar15,pcVar12,(fdb_kvs_config *)pfVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108d15;
    uVar10 = uVar10 + 1;
    ppfVar15 = ppfVar15 + 1;
  } while (uVar10 != 8);
  ppfVar15 = (fdb_kvs_handle **)(auStack_bc0 + 0x58);
  pcVar12 = acStack_ae8;
  uVar11 = 0;
  do {
    uVar10 = 0;
    do {
      pcStackY_c40 = (code *)0x108b18;
      sprintf((char *)ppfVar15,"%dkey%d",uVar11,uVar10 & 0xffffffff);
      pcStackY_c40 = (code *)0x108b2b;
      sprintf(pcVar12,"commit%d",uVar11);
      pfVar7 = apfStack_c18[uVar10];
      pcStackY_c40 = (code *)0x108b38;
      pcVar4 = (char *)strlen((char *)ppfVar15);
      pcStackY_c40 = (code *)0x108b43;
      valuelen = strlen(pcVar12);
      pcStackY_c40 = (code *)0x108b57;
      fVar1 = fdb_set_kv(pfVar7,ppfVar15,(size_t)pcVar4,pcVar12,valuelen);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_c40 = (code *)0x108d10;
        e2e_multi_kvs_concurrent_wr();
        goto LAB_00108d10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 8);
    pcStackY_c40 = (code *)0x108b77;
    fVar1 = fdb_commit(pfStack_c30,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108d1a;
    uVar9 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar9;
  } while (uVar9 != 10);
  lVar6 = 0;
  do {
    pcStackY_c40 = (code *)0x108bae;
    pthread_create((pthread_t *)(auStack_bc0 + lVar6 + 0x18),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStack_c18 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x40);
  pfVar7 = (fdb_kvs_handle *)0x0;
  do {
    pcStackY_c40 = (code *)0x108bd2;
    pthread_join(*(pthread_t *)((long)&pfVar7->kvs + (long)auStack_bc0),
                 (void **)(auStack_bc0 + 0x28 + (long)&(pfVar7->config).chunksize));
    pcStackY_c40 = (code *)0x108be4;
    fVar1 = fdb_rollback((fdb_kvs_handle **)((long)apfStack_c18 + (long)pfVar7),7);
    ppfVar15 = (fdb_kvs_handle **)0x40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108d1f;
    pfVar7 = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
  } while (pfVar7 != (fdb_kvs_handle *)0x40);
  pcStackY_c40 = (code *)0x108c05;
  fVar1 = fdb_commit(pfStack_c30,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar4 = (char *)0x0;
    pfVar7 = (fdb_kvs_handle *)&pfStack_c28;
    ppfVar15 = &pfStack_c20;
    while( true ) {
      pcStackY_c40 = (code *)0x108c38;
      fVar1 = fdb_iterator_init(apfStack_c18[(long)pcVar4],(fdb_iterator **)pfVar7,(void *)0x0,0,
                                (void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      uVar11 = 7;
      do {
        pcStackY_c40 = (code *)0x108c52;
        fVar1 = fdb_iterator_get(pfStack_c28,(fdb_doc **)ppfVar15);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108d10;
        pcStackY_c40 = (code *)0x108c64;
        fdb_doc_free((fdb_doc *)pfStack_c20);
        pfStack_c20 = (fdb_kvs_handle *)0x0;
        pcStackY_c40 = (code *)0x108c77;
        fVar1 = fdb_iterator_next(pfStack_c28);
        uVar9 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar9;
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar9 != 0) goto LAB_00108d29;
      pcStackY_c40 = (code *)0x108c90;
      fdb_iterator_close(pfStack_c28);
      pcVar4 = pcVar4 + 1;
      if (pcVar4 == (char *)0x8) {
        pcStackY_c40 = (code *)0x108ca8;
        fdb_commit(pfStack_c30,'\x01');
        pcStackY_c40 = (code *)0x108cb2;
        fdb_close(pfStack_c30);
        pcStackY_c40 = (code *)0x108cb7;
        fdb_shutdown();
        pcStackY_c40 = (code *)0x108cbc;
        memleak_end();
        pcStackY_c40 = (code *)0x108cc8;
        system("rm -rf  e2edb_main > errorlog.txt");
        pcVar12 = "%s PASSED\n";
        if (e2e_multi_kvs_concurrent_wr()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStackY_c40 = (code *)0x108cf9;
        fprintf(_stderr,pcVar12,"TEST: e2e multi kvs concurrent wr test");
        return;
      }
    }
LAB_00108d24:
    pcStackY_c40 = (code *)0x108d29;
    e2e_multi_kvs_concurrent_wr();
LAB_00108d29:
    pcStackY_c40 = (code *)0x108d2e;
    e2e_multi_kvs_concurrent_wr();
  }
  pcStackY_c40 = e2e_multi_kvs_concurrent_wr_compact;
  e2e_multi_kvs_concurrent_wr();
  pfStackY_c68 = pfVar7;
  pcStackY_c60 = pcVar12;
  uStackY_c58 = uVar10;
  ppfStackY_c50 = ppfVar15;
  pcStackY_c48 = pcVar4;
  pcStackY_c40 = (code *)uVar11;
  gettimeofday(&tStackY_f40,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  rm_storage_fs();
  system("rm -rf  e2edb_ex* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStackY_de8.compaction_mode = '\0';
  ppfVar15 = apfStackY_f30;
  uVar11 = 0;
  iVar2 = 0;
  do {
    sprintf(acStackY_e30,"e2edb_ex%d",uVar11 & 0xffffffff);
    ptr_fhandle = (fdb_file_handle *)((long)&fStackY_f80 + uVar11 * 8);
    pcVar12 = acStackY_e30;
    pfVar7 = (fdb_kvs_handle *)ptr_fhandle;
    fVar1 = fdb_open((fdb_file_handle **)ptr_fhandle,acStackY_e30,&fStackY_de8);
    uVar9 = (uint)pcVar12;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00108f44:
      e2e_multi_kvs_concurrent_wr_compact();
      goto LAB_00108f49;
    }
    lVar6 = 0;
    ptr_handle = ppfVar15;
    do {
      sprintf(acStackY_e30,"e2edb_kv%d",(ulong)(uint)((int)lVar6 + iVar2));
      pfVar7 = ptr_fhandle->root;
      ppfVar13 = ptr_handle;
      fVar1 = fdb_kvs_open((fdb_file_handle *)pfVar7,ptr_handle,acStackY_e30,
                           (fdb_kvs_config *)auStackY_f58);
      uVar9 = (uint)ppfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        e2e_multi_kvs_concurrent_wr_compact();
        goto LAB_00108f44;
      }
      lVar6 = lVar6 + 1;
      ptr_handle = ptr_handle + 1;
    } while (lVar6 != 4);
    uVar11 = uVar11 + 1;
    iVar2 = iVar2 + 4;
    ppfVar15 = ppfVar15 + 4;
  } while (uVar11 != 4);
  lVar6 = 0;
  do {
    pfVar7 = *(fdb_kvs_handle **)((long)&fStackY_f80 + lVar6 * 8);
    uVar9 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar7,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108f49;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    pthread_create((pthread_t *)((long)apStackY_eb0 + lVar6),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)apfStackY_f30 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  lVar6 = 0;
  do {
    pthread_join(*(pthread_t *)((long)apStackY_eb0 + lVar6),(void **)((long)apvStackY_cf0 + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  lVar6 = 0;
  while( true ) {
    pfVar7 = *(fdb_kvs_handle **)((long)&fStackY_f80 + lVar6 * 8);
    uVar9 = 1;
    fVar1 = fdb_commit((fdb_file_handle *)pfVar7,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      lVar6 = 0;
      do {
        fdb_close(*(fdb_file_handle **)((long)&fStackY_f80 + lVar6 * 8));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      fdb_shutdown();
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (e2e_multi_kvs_concurrent_wr_compact()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar12,"TEST: e2e multi kvs concurrent wr test with compaction");
      return;
    }
  }
LAB_00108f4e:
  e2e_multi_kvs_concurrent_wr_compact();
  if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      iVar2 = rand();
      *(char *)((long)&((fdb_file_handle *)pfVar7)->root + uVar11) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar2 % 0x3e];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
    *(undefined1 *)((long)pfVar7 + ((ulong)uVar9 - 1)) = 0;
  }
  return;
LAB_00108879:
  pcStack_5f0 = (code *)0x10887e;
  e2e_crash_recover_test();
LAB_0010887e:
  pcStack_5f0 = (code *)0x108883;
  e2e_crash_recover_test();
  goto LAB_00108883;
LAB_00108d10:
  pcStackY_c40 = (code *)0x108d15;
  e2e_multi_kvs_concurrent_wr();
LAB_00108d15:
  pcStackY_c40 = (code *)0x108d1a;
  e2e_multi_kvs_concurrent_wr();
LAB_00108d1a:
  pcStackY_c40 = (code *)0x108d1f;
  e2e_multi_kvs_concurrent_wr();
LAB_00108d1f:
  pcStackY_c40 = (code *)0x108d24;
  e2e_multi_kvs_concurrent_wr();
  goto LAB_00108d24;
LAB_00108f49:
  e2e_multi_kvs_concurrent_wr_compact();
  goto LAB_00108f4e;
}

Assistant:

void e2e_crash_recover_test(bool do_rollback) {

    TEST_INIT();
    memleak_start();

    randomize();

    bool walflush = true;
    int i, n;
    int n_checkpoints =  2;

    rm_storage_fs();
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_handle *snap_db;
    fdb_kvs_info info;
    fdb_status status;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration

    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    for (i = 0; i < 100; ++i) {
        load_persons(st);
        e2e_fdb_commit(st->main, true);
    }

    fdb_seqnum_t seqno;
    uint64_t k, num_markers;
    fdb_snapshot_info_t *markers;

    if (do_rollback) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            // rollback to each marker
            seqno = markers[k].kvs_markers[0].seqnum;
            status = fdb_rollback(&st->all_docs, seqno);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_free_snap_markers(markers, num_markers);
    } else {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            load_persons(st);
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    // close storage
    e2e_fdb_close(st);

    corrupt_latest_superblock(E2EDB_MAIN);

    // reopen storage
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // run verifiable workload
    for (n = 0; n < n_checkpoints; ++n) {
        load_persons(st);
        for (i = 0; i < 100; ++i) {
            load_persons(st);
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    // teardown
    e2e_fdb_shutdown(st);
    memleak_end();
    if (do_rollback) {
        TEST_RESULT("TEST: e2e crash recover test with rollback");
    } else {
        TEST_RESULT("TEST: e2e crash recover test");
    }
}